

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

array_range_type __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  byte bVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  array_range_type aVar2;
  string local_38;
  
  bVar1 = (byte)(this->field_0).json_const_pointer_ & 0xf;
  if (bVar1 == 9) {
    aVar2 = array_range((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        (this->field_0).long_str_.ptr_);
  }
  else {
    if (bVar1 != 0xe) {
      this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not an array","");
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
      __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    aVar2 = *(array_range_type *)
             &(((this->field_0).byte_str_.ptr_)->
              super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8;
  }
  return aVar2;
}

Assistant:

array_range_type array_range()
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return array_range_type(cast<array_storage>().value().begin(),
                        cast<array_storage>().value().end());
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().array_range();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an array"));
            }
        }